

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O1

int ffomem(fitsfile **fptr,char *name,int mode,void **buffptr,size_t *buffsize,size_t deltasize,
          _func_void_ptr_void_ptr_size_t *mem_realloc,int *status)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  fitsfile *fptr_00;
  FITSfile *pFVar4;
  size_t sVar5;
  char *pcVar6;
  LONGLONG *pLVar7;
  char *pcVar8;
  long lVar9;
  fitsfile **ppfVar10;
  fitsdriver *__s1;
  uint uVar11;
  ulong uVar12;
  char *pcVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int handle;
  int extvers;
  int movetotype;
  int extnum;
  int hdutyp;
  LONGLONG filesize;
  char extname [71];
  char urltype [20];
  char errmsg [81];
  char imagecolname [71];
  char extspec [1025];
  char rowexpress [1025];
  char colspec [1025];
  char binspec [1025];
  char rowfilter [1025];
  char outfile [1025];
  char infile [1025];
  int local_1df4;
  fitsfile **local_1df0;
  int local_1de8;
  int local_1de4;
  void **local_1de0;
  int local_1dd4;
  uint local_1dd0;
  int local_1dcc;
  size_t *local_1dc8;
  LONGLONG local_1dc0;
  char local_1db8 [80];
  char local_1d68 [32];
  char local_1d48 [96];
  char local_1ce8 [80];
  char local_1c98 [1040];
  char local_1888 [1040];
  char local_1478 [1040];
  char local_1068 [1040];
  char local_c58 [1040];
  char local_848 [1040];
  char local_438 [1032];
  
  if (0 < *status) {
    return *status;
  }
  *fptr = (fitsfile *)0x0;
  if (need_to_initialize != 0) {
    local_1de0 = buffptr;
    iVar2 = fits_init_cfitsio();
    *status = iVar2;
    buffptr = local_1de0;
    if (0 < iVar2) {
      return iVar2;
    }
  }
  pcVar13 = name + -1;
  do {
    pcVar6 = pcVar13 + 1;
    pcVar13 = pcVar13 + 1;
  } while (*pcVar6 == ' ');
  local_1df0 = fptr;
  local_1de0 = (void **)deltasize;
  local_1dd4 = mode;
  local_1dc8 = buffsize;
  ffifile2(pcVar13,local_1d68,local_438,local_848,local_1c98,local_c58,local_1068,local_1478,
           (char *)0x0,(char *)0x0,status);
  builtin_strncpy(local_1d68,"memkeep://",0xb);
  uVar12 = (ulong)(uint)no_of_drivers;
  __s1 = driverTable + uVar12;
  do {
    __s1 = __s1 + -1;
    uVar3 = (uint)uVar12;
    if ((int)uVar3 < 1) {
      iVar2 = 0x7c;
      uVar11 = uVar3;
      goto LAB_0011a166;
    }
    iVar2 = strcmp(__s1->prefix,local_1d68);
    uVar12 = (ulong)(uVar3 - 1);
  } while (iVar2 != 0);
  iVar2 = 0;
  uVar11 = uVar3 - 1;
LAB_0011a166:
  *status = iVar2;
  if ((int)uVar3 < 1) {
    pcVar13 = "could not find driver for pre-existing memory file: (ffomem)";
  }
  else {
    iVar2 = mem_openmem(buffptr,local_1dc8,(size_t)local_1de0,mem_realloc,&local_1df4);
    *status = iVar2;
    if (iVar2 < 1) {
      iVar2 = (*driverTable[(int)uVar11].size)(local_1df4,&local_1dc0);
      *status = iVar2;
      if (iVar2 < 1) {
        fptr_00 = (fitsfile *)calloc(1,0x10);
        ppfVar10 = local_1df0;
        *local_1df0 = fptr_00;
        if (fptr_00 == (fitsfile *)0x0) {
          (*driverTable[(int)uVar11].close)(local_1df4);
          ffpmsg("failed to allocate structure for following file: (ffomem)");
          ffpmsg(pcVar13);
        }
        else {
          pFVar4 = (FITSfile *)calloc(1,0x7e8);
          fptr_00->Fptr = pFVar4;
          if (pFVar4 == (FITSfile *)0x0) {
            (*driverTable[(int)uVar11].close)(local_1df4);
            ffpmsg("failed to allocate structure for following file: (ffomem)");
            ffpmsg(pcVar13);
            free(*ppfVar10);
            *ppfVar10 = (fitsfile *)0x0;
            goto LAB_0011a4a3;
          }
          sVar5 = strlen(pcVar13);
          uVar3 = (int)sVar5 + 1;
          sVar5 = 0x20;
          if (0x20 < (int)uVar3) {
            sVar5 = (size_t)uVar3;
          }
          pcVar6 = (char *)malloc(sVar5);
          pFVar4->filename = pcVar6;
          if (pcVar6 == (char *)0x0) {
            (*driverTable[(int)uVar11].close)(local_1df4);
            ffpmsg("failed to allocate memory for filename: (ffomem)");
            ffpmsg(pcVar13);
            ppfVar10 = local_1df0;
          }
          else {
            pLVar7 = (LONGLONG *)calloc(0x3e9,8);
            pFVar4->headstart = pLVar7;
            if (pLVar7 == (LONGLONG *)0x0) {
              (*driverTable[(int)uVar11].close)(local_1df4);
              ffpmsg("failed to allocate memory for headstart array: (ffomem)");
              ffpmsg(pcVar13);
              ppfVar10 = local_1df0;
            }
            else {
              pcVar8 = (char *)calloc(0x28,0xb40);
              pFVar4->iobuffer = pcVar8;
              if (pcVar8 != (char *)0x0) {
                memset(pFVar4->bufrecnum,0xff,0x140);
                iVar2 = 0;
                iVar14 = 1;
                iVar15 = 2;
                iVar16 = 3;
                lVar9 = 0x1d2;
                do {
                  piVar1 = &pFVar4->filehandle + lVar9;
                  *piVar1 = iVar2;
                  piVar1[1] = iVar14;
                  piVar1[2] = iVar15;
                  piVar1[3] = iVar16;
                  iVar2 = iVar2 + 4;
                  iVar14 = iVar14 + 4;
                  iVar15 = iVar15 + 4;
                  iVar16 = iVar16 + 4;
                  lVar9 = lVar9 + 4;
                } while (lVar9 != 0x1fa);
                pFVar4->MAXHDU = 1000;
                pFVar4->filehandle = local_1df4;
                pFVar4->driver = uVar11;
                strcpy(pcVar6,pcVar13);
                pFVar4->filesize = local_1dc0;
                pFVar4->logfilesize = local_1dc0;
                pFVar4->writemode = local_1dd4;
                pFVar4->datastart = -1;
                pFVar4->curbuf = -1;
                pFVar4->open_count = 1;
                pFVar4->validcode = 0x22b;
                pFVar4->noextsyntax = 0;
                ffldrc(fptr_00,0,0,status);
                ppfVar10 = local_1df0;
                if (*status < 1) {
                  lVar9 = 0;
                  do {
                    if (*(long *)((long)FptrTable + lVar9) == 0) {
                      *(FITSfile **)((long)FptrTable + lVar9) = (*local_1df0)->Fptr;
                      break;
                    }
                    lVar9 = lVar9 + 8;
                  } while (lVar9 != 80000);
                }
                iVar2 = ffrhdu(*local_1df0,&local_1dcc,status);
                if (0 < iVar2) {
                  ffpmsg("ffomem could not interpret primary array header of file: (ffomem)");
                  ffpmsg(pcVar13);
                  if (*status == 0xfc) {
                    ffpmsg("This does not look like a FITS file.");
                  }
                  ffclos(*ppfVar10,status);
                  *ppfVar10 = (fitsfile *)0x0;
                }
                local_1ce8[0] = '\0';
                local_1888[0] = '\0';
                if (local_1c98[0] != '\0') {
                  ffexts(local_1c98,(int *)&local_1dd0,local_1db8,&local_1de8,&local_1de4,local_1ce8
                         ,local_1888,status);
                  if (0 < *status) {
                    return *status;
                  }
                  if (local_1dd0 == 0) {
                    if (local_1db8[0] != '\0') {
                      ffmnhd(*ppfVar10,local_1de4,local_1db8,local_1de8,status);
                    }
                  }
                  else {
                    ffmahd(*ppfVar10,local_1dd0 + 1,&local_1dcc,status);
                  }
                  if (0 < *status) {
                    ffpmsg("ffomem could not move to the specified extension:");
                    if ((int)local_1dd0 < 1) {
                      snprintf(local_1d48,0x51," extension with EXTNAME = %s,",local_1db8);
                      ffpmsg(local_1d48);
                      if (local_1de8 != 0) {
                        snprintf(local_1d48,0x51,"           and with EXTVERS = %d,");
                        ffpmsg(local_1d48);
                      }
                      pcVar13 = " doesn\'t exist or couldn\'t be opened.";
                      if ((long)local_1de4 != -1) {
                        snprintf(local_1d48,0x51,"           and with XTENSION = %s,",
                                 *(undefined8 *)(&DAT_0025e400 + (long)local_1de4 * 8));
                        ffpmsg(local_1d48);
                      }
                    }
                    else {
                      pcVar13 = local_1d48;
                      snprintf(pcVar13,0x51,
                               " extension number %d doesn\'t exist or couldn\'t be opened.",
                               (ulong)local_1dd0);
                    }
                    ffpmsg(pcVar13);
                    return *status;
                  }
                }
                goto LAB_0011a1e7;
              }
              (*driverTable[(int)uVar11].close)(local_1df4);
              ffpmsg("failed to allocate memory for iobuffer array: (ffomem)");
              ffpmsg(pcVar13);
              ppfVar10 = local_1df0;
              free((*local_1df0)->Fptr->headstart);
            }
            free((*ppfVar10)->Fptr->filename);
          }
          free((*ppfVar10)->Fptr);
          free(*ppfVar10);
          *ppfVar10 = (fitsfile *)0x0;
        }
LAB_0011a4a3:
        *status = 0x71;
        return 0x71;
      }
      (*driverTable[(int)uVar11].close)(local_1df4);
      pcVar13 = "failed get the size of the memory file: (ffomem)";
    }
    else {
      pcVar13 = "failed to open pre-existing memory file: (ffomem)";
    }
  }
  ffpmsg(pcVar13);
LAB_0011a1e7:
  return *status;
}

Assistant:

int ffomem(fitsfile **fptr,      /* O - FITS file pointer                   */ 
           const char *name,     /* I - name of file to open                */
           int mode,             /* I - 0 = open readonly; 1 = read/write   */
           void **buffptr,       /* I - address of memory pointer           */
           size_t *buffsize,     /* I - size of buffer, in bytes            */
           size_t deltasize,     /* I - increment for future realloc's      */
           void *(*mem_realloc)(void *p, size_t newsize), /* function       */
           int *status)          /* IO - error status                       */
/*
  Open an existing FITS file in core memory.  This is a specialized version
  of ffopen.
*/
{
    int ii, driver, handle, hdutyp, slen, movetotype, extvers, extnum;
    char extname[FLEN_VALUE];
    LONGLONG filesize;
    char urltype[MAX_PREFIX_LEN], infile[FLEN_FILENAME], outfile[FLEN_FILENAME];
    char extspec[FLEN_FILENAME], rowfilter[FLEN_FILENAME];
    char binspec[FLEN_FILENAME], colspec[FLEN_FILENAME];
    char imagecolname[FLEN_VALUE], rowexpress[FLEN_FILENAME];
    char *url, errmsg[FLEN_ERRMSG];
    char *hdtype[3] = {"IMAGE", "TABLE", "BINTABLE"};

    if (*status > 0)
        return(*status);

    *fptr = 0;                   /* initialize null file pointer */

    if (need_to_initialize)           /* this is called only once */
    {
        *status = fits_init_cfitsio();

        if (*status > 0)
            return(*status);
    }

    url = (char *) name;
    while (*url == ' ')  /* ignore leading spaces in the file spec */
        url++;

        /* parse the input file specification */
    fits_parse_input_url(url, urltype, infile, outfile, extspec,
              rowfilter, binspec, colspec, status);

    strcpy(urltype, "memkeep://");   /* URL type for pre-existing memory file */

    *status = urltype2driver(urltype, &driver);

    if (*status > 0)
    {
        ffpmsg("could not find driver for pre-existing memory file: (ffomem)");
        return(*status);
    }

    /* call driver routine to open the memory file */
    FFLOCK;  /* lock this while searching for vacant handle */
    *status =   mem_openmem( buffptr, buffsize,deltasize,
                            mem_realloc,  &handle);
    FFUNLOCK;

    if (*status > 0)
    {
         ffpmsg("failed to open pre-existing memory file: (ffomem)");
         return(*status);
    }

        /* get initial file size */
    *status = (*driverTable[driver].size)(handle, &filesize);

    if (*status > 0)
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed get the size of the memory file: (ffomem)");
        return(*status);
    }

        /* allocate fitsfile structure and initialize = 0 */
    *fptr = (fitsfile *) calloc(1, sizeof(fitsfile));

    if (!(*fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for following file: (ffomem)");
        ffpmsg(url);
        return(*status = MEMORY_ALLOCATION);
    }

        /* allocate FITSfile structure and initialize = 0 */
    (*fptr)->Fptr = (FITSfile *) calloc(1, sizeof(FITSfile));

    if (!((*fptr)->Fptr))
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate structure for following file: (ffomem)");
        ffpmsg(url);
        free(*fptr);
        *fptr = 0;       
        return(*status = MEMORY_ALLOCATION);
    }

    slen = strlen(url) + 1;
    slen = maxvalue(slen, 32); /* reserve at least 32 chars */ 
    ((*fptr)->Fptr)->filename = (char *) malloc(slen); /* mem for file name */

    if ( !(((*fptr)->Fptr)->filename) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for filename: (ffomem)");
        ffpmsg(url);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for headstart array */
    ((*fptr)->Fptr)->headstart = (LONGLONG *) calloc(1001, sizeof(LONGLONG)); 

    if ( !(((*fptr)->Fptr)->headstart) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for headstart array: (ffomem)");
        ffpmsg(url);
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* mem for file I/O buffers */
    ((*fptr)->Fptr)->iobuffer = (char *) calloc(NIOBUF, IOBUFLEN);

    if ( !(((*fptr)->Fptr)->iobuffer) )
    {
        (*driverTable[driver].close)(handle);  /* close the file */
        ffpmsg("failed to allocate memory for iobuffer array: (ffomem)");
        ffpmsg(url);
        free( ((*fptr)->Fptr)->headstart);    /* free memory for headstart array */
        free( ((*fptr)->Fptr)->filename);
        free((*fptr)->Fptr);
        free(*fptr);
        *fptr = 0;              /* return null file pointer */
        return(*status = MEMORY_ALLOCATION);
    }

    /* initialize the ageindex array (relative age of the I/O buffers) */
    /* and initialize the bufrecnum array as being empty */
    for (ii = 0; ii < NIOBUF; ii++)  {
        ((*fptr)->Fptr)->ageindex[ii] = ii;
        ((*fptr)->Fptr)->bufrecnum[ii] = -1;
    }

        /* store the parameters describing the file */
    ((*fptr)->Fptr)->MAXHDU = 1000;              /* initial size of headstart */
    ((*fptr)->Fptr)->filehandle = handle;        /* file handle */
    ((*fptr)->Fptr)->driver = driver;            /* driver number */
    strcpy(((*fptr)->Fptr)->filename, url);      /* full input filename */
    ((*fptr)->Fptr)->filesize = filesize;        /* physical file size */
    ((*fptr)->Fptr)->logfilesize = filesize;     /* logical file size */
    ((*fptr)->Fptr)->writemode = mode;      /* read-write mode    */
    ((*fptr)->Fptr)->datastart = DATA_UNDEFINED; /* unknown start of data */
    ((*fptr)->Fptr)->curbuf = -1;             /* undefined current IO buffer */
    ((*fptr)->Fptr)->open_count = 1;     /* structure is currently used once */
    ((*fptr)->Fptr)->validcode = VALIDSTRUC; /* flag denoting valid structure */
    ((*fptr)->Fptr)->noextsyntax = 0;  /* extended syntax can be used in filename */

    ffldrc(*fptr, 0, REPORT_EOF, status);     /* load first record */

    fits_store_Fptr( (*fptr)->Fptr, status);  /* store Fptr address */

    if (ffrhdu(*fptr, &hdutyp, status) > 0)  /* determine HDU structure */
    {
        ffpmsg(
          "ffomem could not interpret primary array header of file: (ffomem)");
        ffpmsg(url);

        if (*status == UNKNOWN_REC)
           ffpmsg("This does not look like a FITS file.");

        ffclos(*fptr, status);
        *fptr = 0;              /* return null file pointer */
    }

    /* ---------------------------------------------------------- */
    /* move to desired extension, if specified as part of the URL */
    /* ---------------------------------------------------------- */

    imagecolname[0] = '\0';
    rowexpress[0] = '\0';

    if (*extspec)
    {
       /* parse the extension specifier into individual parameters */
       ffexts(extspec, &extnum, 
         extname, &extvers, &movetotype, imagecolname, rowexpress, status);


      if (*status > 0)
          return(*status);

      if (extnum)
      {
        ffmahd(*fptr, extnum + 1, &hdutyp, status);
      }
      else if (*extname) /* move to named extension, if specified */
      {
        ffmnhd(*fptr, movetotype, extname, extvers, status);
      }

      if (*status > 0)
      {
        ffpmsg("ffomem could not move to the specified extension:");
        if (extnum > 0)
        {
          snprintf(errmsg, FLEN_ERRMSG,
          " extension number %d doesn't exist or couldn't be opened.",extnum);
          ffpmsg(errmsg);
        }
        else
        {
          snprintf(errmsg, FLEN_ERRMSG,
          " extension with EXTNAME = %s,", extname);
          ffpmsg(errmsg);

          if (extvers)
          {
             snprintf(errmsg, FLEN_ERRMSG,
             "           and with EXTVERS = %d,", extvers);
             ffpmsg(errmsg);
          }

          if (movetotype != ANY_HDU)
          {
             snprintf(errmsg, FLEN_ERRMSG,
             "           and with XTENSION = %s,", hdtype[movetotype]);
             ffpmsg(errmsg);
          }

          ffpmsg(" doesn't exist or couldn't be opened.");
        }
        return(*status);
      }
    }

    return(*status);
}